

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall defyx::JitCompilerX86::generateProgramEpilogue(JitCompilerX86 *this,Program *prog)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  
  __n = (size_t)loopStoreSize;
  memcpy(this->code + this->codePos,_codeLoopStore,__n);
  lVar4 = (long)this->codePos + __n;
  this->codePos = (int32_t)lVar4;
  puVar2 = this->code;
  puVar2[lVar4 + 2] = '\x01';
  puVar2 = puVar2 + lVar4;
  puVar2[0] = 0x83;
  puVar2[1] = 0xeb;
  iVar3 = this->codePos + 3;
  this->codePos = iVar3;
  puVar2 = this->code;
  (puVar2 + iVar3)[0] = '\x0f';
  (puVar2 + iVar3)[1] = 0x85;
  iVar1 = this->codePos;
  iVar3 = iVar1 + 2;
  this->codePos = iVar3;
  *(int *)(this->code + iVar3) = (prologueSize - iVar1) + -6;
  iVar3 = this->codePos + 4;
  this->codePos = iVar3;
  this->code[iVar3] = 0xe9;
  iVar3 = this->codePos;
  this->codePos = iVar3 + 1;
  *(int *)(this->code + (long)iVar3 + 1) = (epilogueOffset - iVar3) + -5;
  this->codePos = this->codePos + 4;
  return;
}

Assistant:

void JitCompilerX86::generateProgramEpilogue(Program& prog) {
		memcpy(code + codePos, codeLoopStore, loopStoreSize);
		codePos += loopStoreSize;
		emit(SUB_EBX);
		emit(JNZ);
		emit32(prologueSize - codePos - 4);
		emitByte(JMP);
		emit32(epilogueOffset - codePos - 4);
	}